

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int stride0,uint8_t *src1,
               int stride1,int h,int w)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  long lVar26;
  undefined7 in_register_00000031;
  int iVar27;
  int j;
  short sVar28;
  short sVar30;
  undefined1 auVar29 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ushort uVar34;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM5 [16];
  
  auVar29 = ZEXT416((uint)((int)CONCAT71(in_register_00000031,mask_type) != 1) * 0x40 - 0x1a);
  auVar29 = pshuflw(auVar29,auVar29,0);
  sVar28 = auVar29._0_2_;
  sVar30 = auVar29._2_2_;
  if (w == 4) {
    lVar26 = 0;
    do {
      auVar29._4_4_ = *(undefined4 *)(src0 + stride0);
      auVar29._0_4_ = *(undefined4 *)src0;
      auVar29._8_8_ = 0;
      auVar29 = pmovzxbw(auVar29,auVar29);
      auVar44._4_4_ = *(undefined4 *)(src1 + stride1);
      auVar44._0_4_ = *(undefined4 *)src1;
      auVar44._8_8_ = 0;
      auVar36 = pmovzxbw(auVar44,auVar44);
      uVar18 = auVar36._0_2_;
      uVar34 = auVar29._0_2_;
      uVar19 = auVar36._2_2_;
      uVar37 = auVar29._2_2_;
      uVar20 = auVar36._4_2_;
      uVar38 = auVar29._4_2_;
      uVar21 = auVar36._6_2_;
      uVar39 = auVar29._6_2_;
      uVar22 = auVar36._8_2_;
      uVar40 = auVar29._8_2_;
      uVar23 = auVar36._10_2_;
      uVar41 = auVar29._10_2_;
      uVar24 = auVar36._12_2_;
      uVar42 = auVar29._12_2_;
      uVar43 = auVar29._14_2_;
      uVar25 = auVar36._14_2_;
      auVar36._0_2_ =
           ((ushort)(((uVar34 < uVar18) * uVar18 | (uVar34 >= uVar18) * uVar34) -
                    ((uVar18 < uVar34) * uVar18 | (uVar18 >= uVar34) * uVar34)) >> 4) + sVar28;
      auVar36._2_2_ =
           ((ushort)(((uVar37 < uVar19) * uVar19 | (uVar37 >= uVar19) * uVar37) -
                    ((uVar19 < uVar37) * uVar19 | (uVar19 >= uVar37) * uVar37)) >> 4) + sVar30;
      auVar36._4_2_ =
           ((ushort)(((uVar38 < uVar20) * uVar20 | (uVar38 >= uVar20) * uVar38) -
                    ((uVar20 < uVar38) * uVar20 | (uVar20 >= uVar38) * uVar38)) >> 4) + sVar28;
      auVar36._6_2_ =
           ((ushort)(((uVar39 < uVar21) * uVar21 | (uVar39 >= uVar21) * uVar39) -
                    ((uVar21 < uVar39) * uVar21 | (uVar21 >= uVar39) * uVar39)) >> 4) + sVar30;
      auVar36._8_2_ =
           ((ushort)(((uVar40 < uVar22) * uVar22 | (uVar40 >= uVar22) * uVar40) -
                    ((uVar22 < uVar40) * uVar22 | (uVar22 >= uVar40) * uVar40)) >> 4) + sVar28;
      auVar36._10_2_ =
           ((ushort)(((uVar41 < uVar23) * uVar23 | (uVar41 >= uVar23) * uVar41) -
                    ((uVar23 < uVar41) * uVar23 | (uVar23 >= uVar41) * uVar41)) >> 4) + sVar30;
      auVar36._12_2_ =
           ((ushort)(((uVar42 < uVar24) * uVar24 | (uVar42 >= uVar24) * uVar42) -
                    ((uVar24 < uVar42) * uVar24 | (uVar24 >= uVar42) * uVar42)) >> 4) + sVar28;
      auVar36._14_2_ =
           ((ushort)(((uVar43 < uVar25) * uVar25 | (uVar43 >= uVar25) * uVar43) -
                    ((uVar25 < uVar43) * uVar25 | (uVar25 >= uVar43) * uVar43)) >> 4) + sVar30;
      auVar29 = pabsw(auVar36,auVar36);
      sVar2 = auVar29._0_2_;
      sVar3 = auVar29._2_2_;
      sVar4 = auVar29._4_2_;
      sVar5 = auVar29._6_2_;
      sVar6 = auVar29._8_2_;
      sVar7 = auVar29._10_2_;
      sVar8 = auVar29._12_2_;
      sVar9 = auVar29._14_2_;
      *(ulong *)(mask + lVar26 * 4) =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar29[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar29[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar29[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar29[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar29[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar29[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar29[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar29[0] -
                                                                          (0xff < sVar2))))))));
      src0 = src0 + stride0 * 2;
      src1 = src1 + stride1 * 2;
      lVar26 = lVar26 + 2;
    } while ((int)lVar26 < h);
  }
  else if (w == 8) {
    lVar26 = 0;
    do {
      auVar29 = pmovzxbw(in_XMM1,*(undefined8 *)src0);
      in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)src1);
      uVar18 = in_XMM2._0_2_;
      uVar34 = auVar29._0_2_;
      uVar19 = in_XMM2._2_2_;
      uVar37 = auVar29._2_2_;
      uVar20 = in_XMM2._4_2_;
      uVar38 = auVar29._4_2_;
      uVar21 = in_XMM2._6_2_;
      uVar39 = auVar29._6_2_;
      uVar22 = in_XMM2._8_2_;
      uVar40 = auVar29._8_2_;
      uVar23 = in_XMM2._10_2_;
      uVar41 = auVar29._10_2_;
      uVar24 = in_XMM2._12_2_;
      uVar42 = auVar29._12_2_;
      uVar43 = auVar29._14_2_;
      uVar25 = in_XMM2._14_2_;
      auVar31._0_2_ =
           ((ushort)(((uVar34 < uVar18) * uVar18 | (uVar34 >= uVar18) * uVar34) -
                    ((uVar18 < uVar34) * uVar18 | (uVar18 >= uVar34) * uVar34)) >> 4) + sVar28;
      auVar31._2_2_ =
           ((ushort)(((uVar37 < uVar19) * uVar19 | (uVar37 >= uVar19) * uVar37) -
                    ((uVar19 < uVar37) * uVar19 | (uVar19 >= uVar37) * uVar37)) >> 4) + sVar30;
      auVar31._4_2_ =
           ((ushort)(((uVar38 < uVar20) * uVar20 | (uVar38 >= uVar20) * uVar38) -
                    ((uVar20 < uVar38) * uVar20 | (uVar20 >= uVar38) * uVar38)) >> 4) + sVar28;
      auVar31._6_2_ =
           ((ushort)(((uVar39 < uVar21) * uVar21 | (uVar39 >= uVar21) * uVar39) -
                    ((uVar21 < uVar39) * uVar21 | (uVar21 >= uVar39) * uVar39)) >> 4) + sVar30;
      auVar31._8_2_ =
           ((ushort)(((uVar40 < uVar22) * uVar22 | (uVar40 >= uVar22) * uVar40) -
                    ((uVar22 < uVar40) * uVar22 | (uVar22 >= uVar40) * uVar40)) >> 4) + sVar28;
      auVar31._10_2_ =
           ((ushort)(((uVar41 < uVar23) * uVar23 | (uVar41 >= uVar23) * uVar41) -
                    ((uVar23 < uVar41) * uVar23 | (uVar23 >= uVar41) * uVar41)) >> 4) + sVar30;
      auVar31._12_2_ =
           ((ushort)(((uVar42 < uVar24) * uVar24 | (uVar42 >= uVar24) * uVar42) -
                    ((uVar24 < uVar42) * uVar24 | (uVar24 >= uVar42) * uVar42)) >> 4) + sVar28;
      auVar31._14_2_ =
           ((ushort)(((uVar43 < uVar25) * uVar25 | (uVar43 >= uVar25) * uVar43) -
                    ((uVar25 < uVar43) * uVar25 | (uVar25 >= uVar43) * uVar43)) >> 4) + sVar30;
      auVar29 = pabsw(auVar31,auVar31);
      sVar2 = auVar29._0_2_;
      sVar3 = auVar29._2_2_;
      sVar4 = auVar29._4_2_;
      sVar5 = auVar29._6_2_;
      sVar6 = auVar29._8_2_;
      sVar7 = auVar29._10_2_;
      sVar8 = auVar29._12_2_;
      sVar9 = auVar29._14_2_;
      in_XMM1._0_8_ =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar29[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar29[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar29[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar29[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar29[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar29[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar29[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar29[0] -
                                                                          (0xff < sVar2))))))));
      in_XMM1[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar29[0] - (0xff < sVar2);
      in_XMM1[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar29[2] - (0xff < sVar3);
      in_XMM1[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar29[4] - (0xff < sVar4);
      in_XMM1[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar29[6] - (0xff < sVar5);
      in_XMM1[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar29[8] - (0xff < sVar6);
      in_XMM1[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar29[10] - (0xff < sVar7);
      in_XMM1[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar29[0xc] - (0xff < sVar8);
      in_XMM1[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar29[0xe] - (0xff < sVar9);
      *(undefined8 *)(mask + lVar26 * 8) = in_XMM1._0_8_;
      src0 = src0 + stride0;
      src1 = src1 + stride1;
      lVar26 = lVar26 + 1;
    } while ((int)lVar26 < h);
  }
  else {
    iVar27 = 0;
    do {
      lVar26 = 0;
      do {
        auVar29 = *(undefined1 (*) [16])(src0 + lVar26);
        auVar36 = *(undefined1 (*) [16])(src1 + lVar26);
        auVar44 = pmovzxbw(in_XMM4,auVar29);
        in_XMM5 = pmovzxbw(in_XMM5,auVar36);
        auVar32._0_2_ = (ushort)auVar29[8] - (ushort)auVar36[8];
        auVar32._2_2_ = (ushort)auVar29[9] - (ushort)auVar36[9];
        auVar32._4_2_ = (ushort)auVar29[10] - (ushort)auVar36[10];
        auVar32._6_2_ = (ushort)auVar29[0xb] - (ushort)auVar36[0xb];
        auVar32._8_2_ = (ushort)auVar29[0xc] - (ushort)auVar36[0xc];
        auVar32._10_2_ = (ushort)auVar29[0xd] - (ushort)auVar36[0xd];
        auVar32._12_2_ = (ushort)auVar29[0xe] - (ushort)auVar36[0xe];
        auVar32._14_2_ = (ushort)auVar29[0xf] - (ushort)auVar36[0xf];
        uVar18 = in_XMM5._0_2_;
        uVar34 = auVar44._0_2_;
        auVar35._0_2_ = (uVar18 < uVar34) * uVar18 | (uVar18 >= uVar34) * uVar34;
        uVar19 = in_XMM5._2_2_;
        uVar37 = auVar44._2_2_;
        auVar35._2_2_ = (uVar19 < uVar37) * uVar19 | (uVar19 >= uVar37) * uVar37;
        uVar20 = in_XMM5._4_2_;
        uVar38 = auVar44._4_2_;
        auVar35._4_2_ = (uVar20 < uVar38) * uVar20 | (uVar20 >= uVar38) * uVar38;
        uVar21 = in_XMM5._6_2_;
        uVar39 = auVar44._6_2_;
        auVar35._6_2_ = (uVar21 < uVar39) * uVar21 | (uVar21 >= uVar39) * uVar39;
        uVar22 = in_XMM5._8_2_;
        uVar40 = auVar44._8_2_;
        auVar35._8_2_ = (uVar22 < uVar40) * uVar22 | (uVar22 >= uVar40) * uVar40;
        uVar23 = in_XMM5._10_2_;
        uVar41 = auVar44._10_2_;
        auVar35._10_2_ = (uVar23 < uVar41) * uVar23 | (uVar23 >= uVar41) * uVar41;
        uVar24 = in_XMM5._12_2_;
        uVar42 = auVar44._12_2_;
        uVar43 = auVar44._14_2_;
        auVar35._12_2_ = (uVar24 < uVar42) * uVar24 | (uVar24 >= uVar42) * uVar42;
        uVar25 = in_XMM5._14_2_;
        auVar35._14_2_ = (uVar25 < uVar43) * uVar25 | (uVar25 >= uVar43) * uVar43;
        in_XMM4._0_2_ =
             ((ushort)(((uVar34 < uVar18) * uVar18 | (uVar34 >= uVar18) * uVar34) - auVar35._0_2_)
             >> 4) + sVar28;
        in_XMM4._2_2_ =
             ((ushort)(((uVar37 < uVar19) * uVar19 | (uVar37 >= uVar19) * uVar37) - auVar35._2_2_)
             >> 4) + sVar30;
        in_XMM4._4_2_ =
             ((ushort)(((uVar38 < uVar20) * uVar20 | (uVar38 >= uVar20) * uVar38) - auVar35._4_2_)
             >> 4) + sVar28;
        in_XMM4._6_2_ =
             ((ushort)(((uVar39 < uVar21) * uVar21 | (uVar39 >= uVar21) * uVar39) - auVar35._6_2_)
             >> 4) + sVar30;
        in_XMM4._8_2_ =
             ((ushort)(((uVar40 < uVar22) * uVar22 | (uVar40 >= uVar22) * uVar40) - auVar35._8_2_)
             >> 4) + sVar28;
        in_XMM4._10_2_ =
             ((ushort)(((uVar41 < uVar23) * uVar23 | (uVar41 >= uVar23) * uVar41) - auVar35._10_2_)
             >> 4) + sVar30;
        in_XMM4._12_2_ =
             ((ushort)(((uVar42 < uVar24) * uVar24 | (uVar42 >= uVar24) * uVar42) - auVar35._12_2_)
             >> 4) + sVar28;
        in_XMM4._14_2_ =
             ((ushort)(((uVar43 < uVar25) * uVar25 | (uVar43 >= uVar25) * uVar43) - auVar35._14_2_)
             >> 4) + sVar30;
        auVar36 = pabsw(auVar35,in_XMM4);
        auVar29 = pabsw(auVar32,auVar32);
        auVar33._0_2_ = (auVar29._0_2_ >> 4) + sVar28;
        auVar33._2_2_ = (auVar29._2_2_ >> 4) + sVar30;
        auVar33._4_2_ = (auVar29._4_2_ >> 4) + sVar28;
        auVar33._6_2_ = (auVar29._6_2_ >> 4) + sVar30;
        auVar33._8_2_ = (auVar29._8_2_ >> 4) + sVar28;
        auVar33._10_2_ = (auVar29._10_2_ >> 4) + sVar30;
        auVar33._12_2_ = (auVar29._12_2_ >> 4) + sVar28;
        auVar33._14_2_ = (auVar29._14_2_ >> 4) + sVar30;
        auVar29 = pabsw(auVar33,auVar33);
        sVar2 = auVar36._0_2_;
        sVar3 = auVar36._2_2_;
        sVar4 = auVar36._4_2_;
        sVar5 = auVar36._6_2_;
        sVar6 = auVar36._8_2_;
        sVar7 = auVar36._10_2_;
        sVar8 = auVar36._12_2_;
        sVar9 = auVar36._14_2_;
        sVar10 = auVar29._0_2_;
        sVar11 = auVar29._2_2_;
        sVar12 = auVar29._4_2_;
        sVar13 = auVar29._6_2_;
        sVar14 = auVar29._8_2_;
        sVar15 = auVar29._10_2_;
        sVar16 = auVar29._12_2_;
        sVar17 = auVar29._14_2_;
        puVar1 = mask + lVar26;
        *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar36[0] - (0xff < sVar2);
        puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar36[2] - (0xff < sVar3);
        puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar36[4] - (0xff < sVar4);
        puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar36[6] - (0xff < sVar5);
        puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar36[8] - (0xff < sVar6);
        puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar36[10] - (0xff < sVar7);
        puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar36[0xc] - (0xff < sVar8);
        puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar36[0xe] - (0xff < sVar9);
        puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar29[0] - (0xff < sVar10);
        puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar29[2] - (0xff < sVar11);
        puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar29[4] - (0xff < sVar12);
        puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar29[6] - (0xff < sVar13);
        puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar29[8] - (0xff < sVar14);
        puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar29[10] - (0xff < sVar15);
        puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar29[0xc] - (0xff < sVar16);
        puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar29[0xe] - (0xff < sVar17);
        lVar26 = lVar26 + 0x10;
      } while (lVar26 < w);
      src0 = src0 + stride0;
      src1 = src1 + stride1;
      mask = mask + w;
      iVar27 = iVar27 + 1;
    } while (iVar27 < h);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_sse4_1(uint8_t *mask,
                                            DIFFWTD_MASK_TYPE mask_type,
                                            const uint8_t *src0, int stride0,
                                            const uint8_t *src1, int stride1,
                                            int h, int w) {
  const int mb = (mask_type == DIFFWTD_38_INV) ? AOM_BLEND_A64_MAX_ALPHA : 0;
  const __m128i mask_base = _mm_set1_epi16(38 - mb);
  int i = 0;
  if (4 == w) {
    do {
      const __m128i s0A = _mm_cvtsi32_si128(*(int *)src0);
      const __m128i s0B = _mm_cvtsi32_si128(*(int *)(src0 + stride0));
      const __m128i s0AB = _mm_unpacklo_epi32(s0A, s0B);
      const __m128i s0 = _mm_cvtepu8_epi16(s0AB);

      const __m128i s1A = _mm_cvtsi32_si128(*(int *)src1);
      const __m128i s1B = _mm_cvtsi32_si128(*(int *)(src1 + stride1));
      const __m128i s1AB = _mm_unpacklo_epi32(s1A, s1B);
      const __m128i s1 = _mm_cvtepu8_epi16(s1AB);

      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);

      *(int *)mask = _mm_cvtsi128_si32(m8);
      *(int *)(mask + w) = _mm_extract_epi32(m8, 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += 8;
      i += 2;
    } while (i < h);
  } else if (8 == w) {
    do {
      __m128i s0 = _mm_loadl_epi64((__m128i const *)src0);
      __m128i s1 = _mm_loadl_epi64((__m128i const *)src1);
      s0 = _mm_cvtepu8_epi16(s0);
      s1 = _mm_cvtepu8_epi16(s1);
      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);
      _mm_storel_epi64((__m128i *)mask, m8);
      src0 += stride0;
      src1 += stride1;
      mask += 8;
      i += 1;
    } while (i < h);
  } else {
    const __m128i zero = _mm_setzero_si128();
    do {
      int j = 0;
      do {
        const __m128i s0 = _mm_load_si128((__m128i const *)(src0 + j));
        const __m128i s1 = _mm_load_si128((__m128i const *)(src1 + j));
        const __m128i s0L = _mm_cvtepu8_epi16(s0);
        const __m128i s1L = _mm_cvtepu8_epi16(s1);
        const __m128i s0H = _mm_unpackhi_epi8(s0, zero);
        const __m128i s1H = _mm_unpackhi_epi8(s1, zero);

        const __m128i m16L = calc_mask(mask_base, s0L, s1L);
        const __m128i m16H = calc_mask(mask_base, s0H, s1H);

        const __m128i m8 = _mm_packus_epi16(m16L, m16H);
        _mm_store_si128((__m128i *)(mask + j), m8);
        j += 16;
      } while (j < w);
      src0 += stride0;
      src1 += stride1;
      mask += w;
      i += 1;
    } while (i < h);
  }
}